

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::UniversalPrintArray<int>(int *begin,size_t N,iu_ostream *os)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  if (N == 0) {
    pcVar2 = "{}";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
    std::ostream::operator<<(os,*begin);
    if (N < 0x13) {
      pcVar2 = " }";
      if (N != 1) {
        sVar1 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          std::ostream::operator<<(os,begin[sVar1]);
          sVar1 = sVar1 + 1;
        } while (N != sVar1);
      }
    }
    else {
      lVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        std::ostream::operator<<(os,begin[lVar3 + 1]);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      std::__ostream_insert<char,std::char_traits<char>>(os,", ..., ",7);
      std::ostream::operator<<(os,begin[N - 9]);
      lVar3 = -0x20;
      pcVar2 = " }";
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        std::ostream::operator<<(os,*(int *)((long)begin + lVar3 + N * 4));
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,2);
  return;
}

Assistant:

inline void IUTEST_ATTRIBUTE_UNUSED_ UniversalPrintArray(const T* begin, size_t N, iu_ostream* os)
{
    if( N == 0 )
    {
        *os << "{}";
    }
    else
    {
        *os << "{ ";
        const size_t kThreshold = kValues::PrintArrayThreshold;
        const size_t kChunksize = kValues::PrintArrayChunksize;
        if( N <= kThreshold )
        {
            PrintRawArrayTo(begin, N, os);
        }
        else
        {
            PrintRawArrayTo(begin, kChunksize, os);
            *os << ", ..., ";
            PrintRawArrayTo(begin + N - kChunksize, kChunksize, os);
        }
        *os << " }";
    }
}